

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_18::Poppifier::emitCatchAll(Poppifier *this,Try *curr)

{
  value_type *pvVar1;
  size_t sVar2;
  Expression **expr;
  Kind local_24;
  reference local_20;
  value_type *scope;
  Try *curr_local;
  Poppifier *this_local;
  
  scope = (value_type *)curr;
  curr_local = (Try *)this;
  local_20 = std::
             vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
             ::back(&this->scopeStack);
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     &scope[2].instrs);
  if (sVar2 == 1) {
    if (local_20->kind != Try) {
      __assert_fail("scope.kind == Scope::Try",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                    ,0x10b,"void wasm::(anonymous namespace)::Poppifier::emitCatchAll(Try *)");
    }
    patchScope(this,(Expression **)(scope + 1));
  }
  else {
    if (local_20->kind != Catch) {
      __assert_fail("scope.kind == Scope::Catch",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                    ,0x10e,"void wasm::(anonymous namespace)::Poppifier::emitCatchAll(Try *)");
    }
    pvVar1 = scope + 2;
    sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       &scope[2].instrs);
    expr = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                     ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                      &pvVar1->instrs,sVar2 - 2);
    patchScope(this,expr);
  }
  local_24 = Catch;
  std::
  vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
  ::emplace_back<wasm::(anonymous_namespace)::Poppifier::Scope::Kind>(&this->scopeStack,&local_24);
  return;
}

Assistant:

void Poppifier::emitCatchAll(Try* curr) {
  [[maybe_unused]] auto& scope = scopeStack.back();
  if (curr->catchBodies.size() == 1) {
    assert(scope.kind == Scope::Try);
    patchScope(curr->body);
  } else {
    assert(scope.kind == Scope::Catch);
    patchScope(curr->catchBodies[curr->catchBodies.size() - 2]);
  }
  scopeStack.emplace_back(Scope::Catch);
}